

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ticket-translation.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  variant_alternative_t<1UL,_variant<int,_basic_ifstream<char>_>_> *file_00;
  ostream *poVar1;
  variant_alternative_t<0UL,_variant<int,_basic_ifstream<char>_>_> *pvVar2;
  int iVar3;
  long lVar4;
  size_t i;
  ulong uVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  puzzle solved;
  puzzle puzzle;
  puzzle local_280;
  variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> file;
  
  if (argc == 2) {
    get_input(&file,2,argv);
    if (file.super__Variant_base<int,_std::basic_ifstream<char,_std::char_traits<char>_>_>.
        super__Move_assign_alias<int,_std::basic_ifstream<char>_>.
        super__Copy_assign_alias<int,_std::basic_ifstream<char>_>.
        super__Move_ctor_alias<int,_std::basic_ifstream<char>_>.
        super__Copy_ctor_alias<int,_std::basic_ifstream<char>_>.
        super__Variant_storage_alias<int,_std::basic_ifstream<char>_>._M_index == '\0') {
      pvVar2 = std::get<0ul,int,std::ifstream>(&file);
      iVar3 = *pvVar2;
    }
    else {
      file_00 = std::get<1ul,int,std::ifstream>(&file);
      tokenize_abi_cxx11_<std::ifstream>(&tokens,file_00);
      read_input(&puzzle,&tokens);
      ticket_scanning_error_rate(&puzzle);
      poVar1 = std::operator<<((ostream *)&std::cout,"Part 1: ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<(poVar1,"\n");
      ::puzzle::puzzle(&local_280,&puzzle);
      resolve_field_order(&solved,&local_280);
      ::puzzle::~puzzle(&local_280);
      lVar4 = 0;
      for (uVar5 = 0;
          uVar5 < (ulong)((long)solved.fields.
                                super__Vector_base<puzzle::field,_std::allocator<puzzle::field>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)solved.fields.
                                super__Vector_base<puzzle::field,_std::allocator<puzzle::field>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 6); uVar5 = uVar5 + 1) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&((solved.fields.
                             super__Vector_base<puzzle::field,_std::allocator<puzzle::field>_>.
                             _M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                   lVar4),"departure",0);
        lVar4 = lVar4 + 0x40;
      }
      poVar1 = std::operator<<((ostream *)&std::cout,"Part 2: ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<(poVar1,"\n");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      poVar1 = std::operator<<(poVar1,"\n");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::endl<char,std::char_traits<char>>(poVar1);
      ::puzzle::~puzzle(&solved);
      ::puzzle::~puzzle(&puzzle);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&tokens);
      iVar3 = 0;
    }
    std::__detail::__variant::
    _Variant_storage<false,_int,_std::basic_ifstream<char,_std::char_traits<char>_>_>::
    ~_Variant_storage((_Variant_storage<false,_int,_std::basic_ifstream<char,_std::char_traits<char>_>_>
                       *)&file);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"Usage: ");
    poVar1 = std::operator<<(poVar1,*argv);
    poVar1 = std::operator<<(poVar1," {path-to-file}");
    std::endl<char,std::char_traits<char>>(poVar1);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

auto main(int argc, char* argv[]) -> int {
  if (argc != 2) {
    std::cout << "Usage: " << argv[0] << " {path-to-file}" << std::endl;
    return 1;
  }

  auto file = get_input(argc, argv);

  if (std::holds_alternative<int>(file))
    return std::get<int>(file);

  auto& input = std::get<std::ifstream>(file);

  auto tokens = tokenize(input);

  auto puzzle = read_input(tokens);

  auto a1 = ticket_scanning_error_rate(puzzle);
  std::cout << "Part 1: " << a1 << "\n";

  auto solved = resolve_field_order(puzzle);
  auto a2 = uint64_t {1};
  for (size_t i = 0; i < solved.fields.size(); i++) {
    if (solved.fields[i].name.find("departure") == 0) {
      a2 *= solved.mine[i];
    }
  }

  std::cout << "Part 2: " << a2 << "\n";
  std::cout << a1 << "\n" << a2 << std::endl;
}